

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode Variant_copy(UA_Variant *src,UA_Variant *dst,UA_DataType *_)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  size_t sStack_30;
  UA_StatusCode retval;
  size_t length;
  UA_DataType *__local;
  UA_Variant *dst_local;
  UA_Variant *src_local;
  
  sStack_30 = src->arrayLength;
  UVar1 = UA_Variant_isScalar(src);
  if (UVar1) {
    sStack_30 = 1;
  }
  src_local._4_4_ = UA_Array_copy(src->data,sStack_30,&dst->data,src->type);
  if (src_local._4_4_ == 0) {
    dst->arrayLength = src->arrayLength;
    dst->type = src->type;
    if (src->arrayDimensions != (UA_UInt32 *)0x0) {
      UVar2 = UA_Array_copy(src->arrayDimensions,src->arrayDimensionsSize,&dst->arrayDimensions,
                            UA_TYPES + 5);
      if (UVar2 != 0) {
        return UVar2;
      }
      dst->arrayDimensionsSize = src->arrayDimensionsSize;
    }
    src_local._4_4_ = 0;
  }
  return src_local._4_4_;
}

Assistant:

static UA_StatusCode
Variant_copy(UA_Variant const *src, UA_Variant *dst, const UA_DataType *_) {
    size_t length = src->arrayLength;
    if(UA_Variant_isScalar(src))
        length = 1;
    UA_StatusCode retval = UA_Array_copy(src->data, length,
                                         &dst->data, src->type);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    dst->arrayLength = src->arrayLength;
    dst->type = src->type;
    if(src->arrayDimensions) {
        retval = UA_Array_copy(src->arrayDimensions, src->arrayDimensionsSize,
            (void**)&dst->arrayDimensions, &UA_TYPES[UA_TYPES_INT32]);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        dst->arrayDimensionsSize = src->arrayDimensionsSize;
    }
    return UA_STATUSCODE_GOOD;
}